

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZMultiphysicsElement_*,_7>::~TPZManVector
          (TPZManVector<TPZMultiphysicsElement_*,_7> *this)

{
  TPZMultiphysicsElement **ppTVar1;
  
  (this->super_TPZVec<TPZMultiphysicsElement_*>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01a089b0;
  if ((this->super_TPZVec<TPZMultiphysicsElement_*>).fStore == this->fExtAlloc) {
    (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore = (TPZMultiphysicsElement **)0x0;
  }
  (this->super_TPZVec<TPZMultiphysicsElement_*>).fNAlloc = 0;
  (this->super_TPZVec<TPZMultiphysicsElement_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01a089f0;
  ppTVar1 = (this->super_TPZVec<TPZMultiphysicsElement_*>).fStore;
  if (ppTVar1 == (TPZMultiphysicsElement **)0x0) {
    return;
  }
  operator_delete__(ppTVar1);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}